

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  iterator iVar1;
  Value *pVVar2;
  CZString key;
  string sStack_1a8;
  key_type local_188 [23];
  
  if (this->field_0x8 == '\0') {
    nullSingleton();
    pVVar2 = &nullSingleton::nullStatic;
  }
  else {
    if (this->field_0x8 != '\x06') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
      std::operator<<((ostream *)local_188,
                      "in Json::Value::operator[](ArrayIndex)const: requires arrayValue");
      std::__cxx11::stringbuf::str();
      throwLogicError(&sStack_1a8);
    }
    local_188[0].cstr_ = (char *)0x0;
    local_188[0].field_1.index_ = index;
    iVar1 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::find(&((this->value_).map_)->_M_t,local_188);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
      nullSingleton();
      pVVar2 = &nullSingleton::nullStatic;
    }
    else {
      pVVar2 = (Value *)&iVar1._M_node[1]._M_left;
    }
    CZString::~CZString(local_188);
  }
  return pVVar2;
}

Assistant:

const Value& Value::operator[](ArrayIndex index) const {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == arrayValue,
      "in Json::Value::operator[](ArrayIndex)const: requires arrayValue");
  if (type_ == nullValue)
    return nullSingleton();
  CZString key(index);
  ObjectValues::const_iterator it = value_.map_->find(key);
  if (it == value_.map_->end())
    return nullSingleton();
  return (*it).second;
}